

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<char_const(&)[24],wabt::(anonymous_namespace)::TagSymbol,char_const(&)[22],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
          (CWriter *this,char (*t) [24],TagSymbol *u,char (*args) [22],Newline *args_1,
          CloseBrace *args_2,Newline *args_3)

{
  string_view local_48;
  CloseBrace *local_38;
  CloseBrace *args_local_2;
  Newline *args_local_1;
  char (*args_local) [22];
  TagSymbol *u_local;
  char (*t_local) [24];
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (CloseBrace *)args_1;
  args_local_1 = (Newline *)args;
  args_local = (char (*) [22])u;
  u_local = (TagSymbol *)t;
  t_local = (char (*) [24])this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,*t);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  anon_unknown_0::CWriter::Write((CWriter *)this,(TagSymbol *)args_local);
  Write<char_const(&)[22],wabt::(anonymous_namespace)::Newline,wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            (this,(char (*) [22])args_local_1,(Newline *)args_local_2,local_38,args_3);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }